

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

void lws_context_destroy3(lws_context *context)

{
  lws_context **pplVar1;
  lws_role_ops *plVar2;
  _func_void_lws_context_ptr_int *p_Var3;
  allocated_headers *ah;
  pollfd *ptr;
  lws_role_ops **pplVar4;
  lws_system_blob_t *b;
  lws_system_blob_item_t type;
  long lVar5;
  lws_context_per_thread *pt;
  
  pplVar1 = context->pcontext_finalize;
  _lws_log(0x10,"%s\n","lws_context_destroy3");
  if (0 < context->count_threads) {
    lVar5 = 0;
    do {
      pt = context->pt + lVar5;
      lws_seq_destroy_all_on_pt(pt);
      plVar2 = available_roles[0];
      pplVar4 = available_roles;
      while (pplVar4 = pplVar4 + 1, plVar2 != (lws_role_ops *)0x0) {
        if (plVar2->pt_init_destroy !=
            (_func_int_lws_context_ptr_lws_context_creation_info_ptr_lws_context_per_thread_ptr_int
             *)0x0) {
          (*plVar2->pt_init_destroy)(context,(lws_context_creation_info *)0x0,pt,1);
        }
        plVar2 = *pplVar4;
      }
      p_Var3 = context->event_loop_ops->destroy_pt;
      if (p_Var3 != (_func_void_lws_context_ptr_int *)0x0) {
        (*p_Var3)(context,(int)lVar5);
      }
      while (ah = (pt->http).ah_list, ah != (allocated_headers *)0x0) {
        _lws_destroy_ah(pt,ah);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < context->count_threads);
  }
  ptr = context->pt[0].fds;
  if (ptr != (pollfd *)0x0) {
    lws_realloc(ptr,0,"free");
    context->pt[0].fds = (pollfd *)0x0;
  }
  lws_context_deinit_ssl_library(context);
  type = LWS_SYSBLOB_TYPE_AUTH;
  do {
    b = lws_system_get_blob(context,type,0);
    lws_system_blob_destroy(b);
    type = type + 1;
  } while (type != LWS_SYSBLOB_TYPE_COUNT);
  lws_realloc(context,0,"lws_free");
  _lws_log(8,"%s: ctx %p freed\n","lws_context_destroy3",context);
  if (pplVar1 != (lws_context **)0x0) {
    *pplVar1 = (lws_context *)0x0;
  }
  return;
}

Assistant:

static void
lws_context_destroy3(struct lws_context *context)
{
	struct lws_context **pcontext_finalize = context->pcontext_finalize;
	int n;

#if defined(LWS_WITH_NETWORK)

	lwsl_debug("%s\n", __func__);

	for (n = 0; n < context->count_threads; n++) {
		struct lws_context_per_thread *pt = &context->pt[n];
		(void)pt;
#if defined(LWS_WITH_SEQUENCER)
		lws_seq_destroy_all_on_pt(pt);
#endif
		LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar) {
			if (ar->pt_init_destroy)
				ar->pt_init_destroy(context, NULL, pt, 1);
		} LWS_FOR_EVERY_AVAILABLE_ROLE_END;

#if defined(LWS_WITH_CGI)
		role_ops_cgi.pt_init_destroy(context, NULL, pt, 1);
#endif

		if (context->event_loop_ops->destroy_pt)
			context->event_loop_ops->destroy_pt(context, n);

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
		while (pt->http.ah_list)
			_lws_destroy_ah(pt, pt->http.ah_list);
#endif
	}

#if defined(LWS_WITH_SYS_ASYNC_DNS)
	lws_async_dns_deinit(&context->async_dns);
#endif
#if defined(LWS_WITH_SYS_DHCP_CLIENT)
	lws_dhcpc_remove(context, NULL);
#endif

	if (context->pt[0].fds)
		lws_free_set_NULL(context->pt[0].fds);
#endif
	lws_context_deinit_ssl_library(context);

#if defined(LWS_WITH_DETAILED_LATENCIES)
	if (context->latencies_fd != -1)
		compatible_close(context->latencies_fd);
#endif

	for (n = 0; n < LWS_SYSBLOB_TYPE_COUNT; n++)
		lws_system_blob_destroy(
				lws_system_get_blob(context, n, 0));

	lws_free(context);
	lwsl_info("%s: ctx %p freed\n", __func__, context);

	if (pcontext_finalize)
		*pcontext_finalize = NULL;
}